

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Expression
dynet::detail::f<dynet::Concatenate,std::initializer_list<dynet::Expression>,unsigned_int>
          (initializer_list<dynet::Expression> *xs,uint *arg1)

{
  uint uVar1;
  ComputationGraph *this;
  VariableIndex VVar2;
  iterator pEVar3;
  long lVar4;
  Expression EVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  allocator_type local_41;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  this = xs->_M_array->pg;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,xs->_M_len,&local_41);
  pEVar3 = xs->_M_array;
  for (lVar4 = xs->_M_len << 4; lVar4 != 0; lVar4 = lVar4 + -0x10) {
    *local_40._M_impl.super__Vector_impl_data._M_start = pEVar3->i;
    pEVar3 = pEVar3 + 1;
    local_40._M_impl.super__Vector_impl_data._M_start =
         local_40._M_impl.super__Vector_impl_data._M_start + 1;
  }
  VVar2 = ComputationGraph::
          add_function<dynet::Concatenate,std::vector<unsigned_int,std::allocator<unsigned_int>>,unsigned_int_const&>
                    (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,arg1);
  uVar1 = this->graph_id;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  EVar5.graph_id = uVar1;
  EVar5.i = VVar2;
  EVar5.pg = this;
  return EVar5;
}

Assistant:

Expression f(const T& xs, const T1& arg1) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis, arg1));
}